

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

Layer * ncnn::create_layer(int index)

{
  Layer *pLVar1;
  
  if (0x4a < (uint)index) {
    return (Layer *)0x0;
  }
  if ((code *)(&PTR_AbsVal_final_layer_creator_001736e8)[(ulong)(uint)index * 2] == (code *)0x0) {
    pLVar1 = (Layer *)0x0;
  }
  else {
    pLVar1 = (Layer *)(*(code *)(&PTR_AbsVal_final_layer_creator_001736e8)[(ulong)(uint)index * 2])
                                ();
    pLVar1->typeindex = index;
  }
  return pLVar1;
}

Assistant:

Layer* create_layer(int index)
{
    if (index < 0 || index >= layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator();
    layer->typeindex = index;
    return layer;
}